

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumeReliablePdu.cpp
# Opt level: O1

bool __thiscall
DIS::StartResumeReliablePdu::operator==(StartResumeReliablePdu *this,StartResumeReliablePdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = SimulationManagementWithReliabilityFamilyPdu::operator==
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                     &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  bVar2 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  bVar3 = ClockTime::operator==(&this->_simulationTime,&rhs->_simulationTime);
  return (((bVar3 && (bVar2 && bVar1)) &&
          this->_requiredReliabilityService == rhs->_requiredReliabilityService) &&
         this->_pad1 == rhs->_pad1) &&
         (this->_requestID == rhs->_requestID && this->_pad2 == rhs->_pad2);
}

Assistant:

bool StartResumeReliablePdu::operator ==(const StartResumeReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_realWorldTime == rhs._realWorldTime) ) ivarsEqual = false;
     if( ! (_simulationTime == rhs._simulationTime) ) ivarsEqual = false;
     if( ! (_requiredReliabilityService == rhs._requiredReliabilityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }